

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_beginend.c
# Opt level: O2

int main(void)

{
  int iVar1;
  
  dpy = get_display_or_skip();
  make_glx_context_current_or_skip(dpy);
  has_argb2101010 = (_Bool)epoxy_has_gl_extension("GL_ARB_vertex_type_2_10_10_10_rev");
  (*_epoxy_glBegin)(4);
  (*_epoxy_glVertex2f)(0,0);
  (*_epoxy_glMultiTexCoord4f)(0,0,0,0,0x84c0);
  if (has_argb2101010 == true) {
    (*_epoxy_glTexCoordP4ui)(0x8368,0);
  }
  (*_epoxy_glEnd)();
  iVar1 = (*_epoxy_glGetError)();
  if (iVar1 == 0) {
    glBegin(4);
    (*_epoxy_glVertex4f)(0,0,0,0);
    (*_epoxy_glMultiTexCoord3f)(0,0,0,0x84c0);
    if (has_argb2101010 == true) {
      (*_epoxy_glTexCoordP3ui)(0x8368,0);
    }
    glEnd();
  }
  return (int)(iVar1 != 0);
}

Assistant:

int main(void)
{
    bool pass = true;

    dpy = get_display_or_skip();
    make_glx_context_current_or_skip(dpy);

    has_argb2101010 =
        epoxy_has_gl_extension("GL_ARB_vertex_type_2_10_10_10_rev");

    pass = pass && test_with_epoxy();
    pass = pass && test_without_epoxy();

    return pass != true;
}